

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int validate_signature(uchar *hash,rtr_signature_seg *sig,spki_record *record)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_80;
  rtr_bgpsec_rtvals retval;
  int status;
  spki_record *record_local;
  rtr_signature_seg *sig_local;
  uchar *hash_local;
  EC_KEY *pub_key;
  char ski_str [61];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash_local = (uchar *)0x0;
  iVar2 = load_public_key((EC_KEY **)&hash_local,record->spki);
  if (iVar2 == 0) {
    iVar2 = ECDSA_verify(0,hash,0x20,sig->signature,(uint)sig->sig_len,(EC_KEY *)hash_local);
    if (iVar2 == -1) {
      lrtr_dbg("BGPSEC: ERROR: Failed to verify EC Signature");
      local_80 = -1;
    }
    else if (iVar2 == 0) {
      lrtr_dbg("BGPSEC: Validation result of signature: invalid");
      local_80 = 2;
    }
    else if (iVar2 == 1) {
      lrtr_dbg("BGPSEC: Validation result of signature: valid");
      local_80 = 1;
    }
    else {
      local_80 = 0;
    }
  }
  else {
    memset(&pub_key,0,0x3d);
    ski_to_char((char *)&pub_key,record->ski);
    lrtr_dbg("BGPSEC: WARNING: Invalid public key for SKI: %s",&pub_key);
    local_80 = -1;
  }
  EC_KEY_free((EC_KEY *)hash_local);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_80;
}

Assistant:

int validate_signature(const unsigned char *hash, const struct rtr_signature_seg *sig, struct spki_record *record)
{
	int status = 0;
	enum rtr_bgpsec_rtvals retval;

	EC_KEY *pub_key = NULL;

	/* Load the contents of the spki buffer into the
	 * OpenSSL public key.
	 */
	retval = load_public_key(&pub_key, record->spki);

	if (retval != RTR_BGPSEC_SUCCESS) {
		/*The output string looks like this: "XX XX XX XX"*/
		/*where XX is a single byte. Including the spaces,*/
		/*we need to multiply by 3. The plus 1 is for the string*/
		/*terminator.*/
		char ski_str[(SKI_SIZE * 3) + 1] = {'\0'};

		ski_to_char(ski_str, record->ski);
		BGPSEC_DBG("WARNING: Invalid public key for SKI: %s", ski_str);
		retval = RTR_BGPSEC_ERROR;
		goto err;
	}

	/* The OpenSSL validation function to validate the signature. */
	status = ECDSA_verify(0, hash, SHA256_DIGEST_LENGTH, sig->signature, sig->sig_len, pub_key);

	switch (status) {
	case -1:
		BGPSEC_DBG1("ERROR: Failed to verify EC Signature");
		retval = RTR_BGPSEC_ERROR;
		break;
	case 0:
		BGPSEC_DBG1("Validation result of signature: invalid");
		retval = RTR_BGPSEC_NOT_VALID;
		break;
	case 1:
		BGPSEC_DBG1("Validation result of signature: valid");
		retval = RTR_BGPSEC_VALID;
		break;
	}

err:
	EC_KEY_free(pub_key);

	return retval;
}